

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O2

void Abc_FlowRetime_ConstrainInit(void)

{
  uint uVar1;
  int iVar2;
  undefined8 *Entry;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar3;
  int iVar4;
  uint cut;
  Abc_Ntk_t *pNtk;
  uint uVar5;
  uint cut_00;
  
  Entry = (undefined8 *)calloc(1,0x28);
  pNtk = pManMR->pInitNtk;
  if (pNtk == (Abc_Ntk_t *)0x0) {
    __assert_fail("pManMR->pInitNtk",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x408,"void Abc_FlowRetime_ConstrainInit()");
  }
  if (pManMR->fVerbose != 0) {
    puts("\tsearch for initial state conflict...");
    pNtk = pManMR->pInitNtk;
  }
  p = Abc_NtkDfs(pNtk,0);
  iVar2 = p->nSize;
  for (iVar4 = 0; iVar4 < pManMR->pInitNtk->vPis->nSize; iVar4 = iVar4 + 1) {
    pAVar3 = Abc_NtkPi(pManMR->pInitNtk,iVar4);
    Vec_PtrPush(p,pAVar3);
  }
  if (p->nSize <= iVar2) {
    __assert_fail("nItems < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x347,"void Vec_PtrReorder(Vec_Ptr_t *, int)");
  }
  Vec_PtrGrow(p,p->nSize + iVar2);
  memmove(p->pArray + p->nSize,p->pArray,(long)iVar2 * 8);
  memmove(p->pArray,p->pArray + iVar2,(long)p->nSize << 3);
  iVar2 = Abc_FlowRetime_PartialSat(p,0);
  if (iVar2 != 0) {
    __assert_fail("!Abc_FlowRetime_PartialSat( vNodes, 0 )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x414,"void Abc_FlowRetime_ConstrainInit()");
  }
  do {
    if (pManMR->fVerbose != 0) {
      printf("\t\t");
    }
    uVar5 = p->nSize;
    cut_00 = 0;
    while (cut_00 != uVar5 - 1) {
      cut = (int)(cut_00 + uVar5) >> 1;
      iVar2 = Abc_FlowRetime_PartialSat(p,cut);
      uVar1 = cut;
      if (iVar2 != 0) {
        uVar1 = cut_00;
        uVar5 = cut;
      }
      cut_00 = uVar1;
      if (pManMR->fVerbose != 0) {
        putchar((uint)(iVar2 == 0) * 3 + 0x2a);
      }
      fflush(_stdout);
    }
    iVar2 = Abc_FlowRetime_PartialSat(p,uVar5);
    if (iVar2 == 0) {
      __assert_fail("Abc_FlowRetime_PartialSat( vNodes, high )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                    ,0x42b,"void Abc_FlowRetime_ConstrainInit()");
    }
    iVar2 = Abc_FlowRetime_PartialSat(p,cut_00);
    if (iVar2 != 0) {
      __assert_fail("!Abc_FlowRetime_PartialSat( vNodes, low )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                    ,0x42c,"void Abc_FlowRetime_ConstrainInit()");
    }
    pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(p,cut_00);
    Abc_NtkMarkCone_rec(pAVar3,1);
    if (pManMR->fVerbose != 0) {
      printf("   conflict term = %d ",(ulong)cut_00);
    }
    while( true ) {
      iVar2 = pAVar3->Id;
      if (pManMR->sizeInitToOrig <= iVar2) {
        __assert_fail("id < pManMR->sizeInitToOrig",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                      ,0x531,"void Abc_FlowRetime_GetInitToOrig(Abc_Obj_t *, Abc_Obj_t **, int *)");
      }
      iVar4 = pManMR->pInitToOrig[iVar2].id;
      if (-1 < iVar4) break;
      if ((pAVar3->vFanins).nSize == 0) {
        __assert_fail("Abc_ObjFaninNum(pInit)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                      ,0x536,"void Abc_FlowRetime_GetInitToOrig(Abc_Obj_t *, Abc_Obj_t **, int *)");
      }
      pAVar3 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray];
    }
    pAVar3 = Abc_NtkObj(pManMR->pNtk,iVar4);
    if (pAVar3 == (Abc_Obj_t *)0x0) {
      __assert_fail("pOrigObj",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                    ,0x43e,"void Abc_FlowRetime_ConstrainInit()");
    }
    uVar5 = pManMR->pInitToOrig[iVar2].lag;
    if (pManMR->fVerbose != 0) {
      printf(" <=> %d/%d\n",(ulong)(uint)pAVar3->Id,(ulong)uVar5);
    }
    Vec_IntPush((Vec_Int_t *)(Entry + 1),pAVar3->Id);
    Vec_IntPush((Vec_Int_t *)(Entry + 3),uVar5);
    iVar2 = Abc_FlowRetime_PartialSat(p,p->nSize);
  } while (iVar2 != 0);
  *Entry = 0;
  Vec_PtrPush(pManMR->vInitConstraints,Entry);
  for (iVar2 = 0; iVar2 < pManMR->pInitNtk->vObjs->nSize; iVar2 = iVar2 + 1) {
    pAVar3 = Abc_NtkObj(pManMR->pInitNtk,iVar2);
    if (pAVar3 != (Abc_Obj_t *)0x0) {
      pAVar3->field_0x14 = pAVar3->field_0x14 & 0xef;
    }
  }
  Vec_PtrFree(p);
  return;
}

Assistant:

void Abc_FlowRetime_ConstrainInit( ) {
  Vec_Ptr_t *vNodes;
  int low, high, mid;
  int i, n, lag;
  Abc_Obj_t *pObj = NULL, *pOrigObj;
  InitConstraint_t *pConstraint = ABC_ALLOC( InitConstraint_t, 1 );

  memset( pConstraint, 0, sizeof(InitConstraint_t) );

  assert(pManMR->pInitNtk);

  vprintf("\tsearch for initial state conflict...\n");

  vNodes = Abc_NtkDfs(pManMR->pInitNtk, 0);
  n = Vec_PtrSize(vNodes);
  // also add PIs to vNodes
  Abc_NtkForEachPi(pManMR->pInitNtk, pObj, i) 
    Vec_PtrPush(vNodes, pObj);
  Vec_PtrReorder(vNodes, n);

#if defined(DEBUG_CHECK)
    assert(!Abc_FlowRetime_PartialSat( vNodes, 0 ));
#endif

  // grow initialization constraint
  do {
    vprintf("\t\t");

    // find element to add to set...
    low = 0, high = Vec_PtrSize(vNodes);
    while (low != high-1) {
      mid = (low + high) >> 1;
      
      if (!Abc_FlowRetime_PartialSat( vNodes, mid )) {
        low = mid;
        vprintf("-");
      } else {
        high = mid;
        vprintf("*");
      }
      fflush(stdout);
    }
      
#if defined(DEBUG_CHECK)
    assert(Abc_FlowRetime_PartialSat( vNodes, high ));
    assert(!Abc_FlowRetime_PartialSat( vNodes, low ));
#endif
    
    // mark its TFO
    pObj = (Abc_Obj_t*)Vec_PtrEntry( vNodes, low );
    Abc_NtkMarkCone_rec( pObj, 1 );
    vprintf("   conflict term = %d ", low);

#if 0
    printf("init ------\n");
    Abc_ObjPrint(stdout, pObj);
    printf("\n");
    Abc_ObjPrintNeighborhood( pObj, 1 );
    printf("------\n");
#endif

    // add node to constraint
    Abc_FlowRetime_GetInitToOrig( pObj, &pOrigObj, &lag );
    assert(pOrigObj);
    vprintf(" <=> %d/%d\n", Abc_ObjId(pOrigObj), lag);

#if 0    
    printf("orig ------\n");
    Abc_ObjPrint(stdout, pOrigObj);
    printf("\n");
    Abc_ObjPrintNeighborhood( pOrigObj, 1 );
    printf("------\n");
#endif
    Vec_IntPush( &pConstraint->vNodes, Abc_ObjId(pOrigObj) );
    Vec_IntPush( &pConstraint->vLags, lag );

  } while (Abc_FlowRetime_PartialSat( vNodes, Vec_PtrSize(vNodes) ));

  pConstraint->pBiasNode = NULL;

  // add constraint
  Vec_PtrPush( pManMR->vInitConstraints, pConstraint );

  // clear marks
  Abc_NtkForEachObj( pManMR->pInitNtk, pObj, i)
    pObj->fMarkA = 0;

  // free
  Vec_PtrFree( vNodes );
}